

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR __thiscall NpyArray::SaveNPZ(NpyArray *this,string *zipname,string *varname,bool bAppend)

{
  size_t sVar1;
  size_t sVar2;
  pointer __n;
  unsigned_short rhs;
  undefined4 uVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  pointer pcVar6;
  byte bVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  size_t __off;
  uint16_t nrecs;
  vector<char,_std::allocator<char>_> globalHeader;
  vector<char,_std::allocator<char>_> localHeader;
  vector<char,_std::allocator<char>_> footer;
  size_t globalHeaderOffset;
  vector<char,_std::allocator<char>_> npyHeader;
  string local_70;
  string local_50;
  
  nrecs = 0;
  globalHeaderOffset = 0;
  globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000009,bAppend) == 0) {
LAB_0012296d:
    __stream = fopen((zipname->_M_dataplus)._M_p,"wb");
    if (__stream == (FILE *)0x0) {
      pcVar5 = "error: unable to open file";
      goto LAB_00122cd3;
    }
    __off = 0;
  }
  else {
    __stream = fopen((zipname->_M_dataplus)._M_p,"r+b");
    if (__stream == (FILE *)0x0) goto LAB_0012296d;
    pcVar5 = ParseFooterZIP((FILE *)__stream,&nrecs,(size_t *)&npyHeader,&globalHeaderOffset);
    __off = globalHeaderOffset;
    if (pcVar5 != (LPCSTR)0x0) goto LAB_00122cd3;
    fseek(__stream,globalHeaderOffset,0);
    __n = npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (&globalHeader,
               (size_type)
               npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    pcVar6 = (pointer)fread(globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,1,(size_t)__n,__stream);
    if (pcVar6 != __n) {
      pcVar5 = "error: header read error while adding to existing zip";
      goto LAB_00122cd3;
    }
    fseek(__stream,__off,0);
  }
  bVar7 = this->type >> 7;
  CreateHeaderNPY(&npyHeader,&this->shape,(this->type ^ bVar7) - bVar7,this->wordSize);
  sVar1 = this->wordSize;
  sVar2 = this->numValues;
  uVar8 = (long)npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar3 = crc32(0,npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar8 & 0xffffffff);
  uVar4 = crc32(uVar3,this->data,(int)this->wordSize * (int)this->numValues);
  std::__cxx11::string::append((char *)varname);
  localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  add(&localHeader,"PK");
  add<unsigned_short>(&localHeader,0x403);
  add<unsigned_short>(&localHeader,0x14);
  add<unsigned_short>(&localHeader,0);
  add<unsigned_short>(&localHeader,0);
  add<unsigned_short>(&localHeader,0);
  add<unsigned_short>(&localHeader,0);
  add<unsigned_int>(&localHeader,uVar4);
  uVar4 = (int)uVar8 + (int)sVar1 * (int)sVar2;
  add<unsigned_int>(&localHeader,uVar4);
  add<unsigned_int>(&localHeader,uVar4);
  add<unsigned_short>(&localHeader,(unsigned_short)varname->_M_string_length);
  add<unsigned_short>(&localHeader,0);
  std::__cxx11::string::string((string *)&local_50,(string *)varname);
  add(&localHeader,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  add(&globalHeader,"PK");
  add<unsigned_short>(&globalHeader,0x201);
  add<unsigned_short>(&globalHeader,0x14);
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,std::allocator<char>> *)&globalHeader,
             (const_iterator)
             globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 4),
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x1e));
  add<unsigned_short>(&globalHeader,0);
  add<unsigned_short>(&globalHeader,0);
  add<unsigned_short>(&globalHeader,0);
  add<unsigned_int>(&globalHeader,0);
  add<unsigned_int>(&globalHeader,(uint)__off);
  std::__cxx11::string::string((string *)&local_70,(string *)varname);
  add(&globalHeader,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  add(&footer,"PK");
  add<unsigned_short>(&footer,0x605);
  add<unsigned_short>(&footer,0);
  add<unsigned_short>(&footer,0);
  rhs = nrecs + 1;
  add<unsigned_short>(&footer,rhs);
  add<unsigned_short>(&footer,rhs);
  add<unsigned_int>(&footer,(int)globalHeader.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                            (int)globalHeader.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
  add<unsigned_int>(&footer,((uint)__off + uVar4 +
                            (int)localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                 .super__Vector_impl_data._M_finish) -
                            (int)localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                 .super__Vector_impl_data._M_start);
  add<unsigned_short>(&footer,0);
  fwrite(localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
         ._M_start,1,
         (long)localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(this->data,this->wordSize,this->numValues,__stream);
  fwrite(globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fclose(__stream);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&footer.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&localHeader.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&npyHeader.super__Vector_base<char,_std::allocator<char>_>);
  pcVar5 = (LPCSTR)0x0;
LAB_00122cd3:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&globalHeader.super__Vector_base<char,_std::allocator<char>_>);
  return pcVar5;
}

Assistant:

LPCSTR NpyArray::SaveNPZ(std::string zipname, std::string varname, bool bAppend) const
{
	FILE* fp;
	uint16_t nrecs = 0;
	size_t globalHeaderOffset = 0;
	std::vector<char> globalHeader;
	if (bAppend && (fp=fopen(zipname.c_str(), "r+b")) != NULL) {
		// zip file exists, add a new NPY array to it;
		// first read the footer and parse the offset and size of the global header
		// then read and store the global header;
		// the new data will be written at the start of the global header,
		// then append the global header and footer below it
		size_t globalHeaderSize;
		LPCSTR ret = ParseFooterZIP(fp, nrecs, globalHeaderSize, globalHeaderOffset);
		if (ret != NULL)
			return ret;
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
		globalHeader.resize(globalHeaderSize);
		size_t res = fread(globalHeader.data(), sizeof(char), globalHeaderSize, fp);
		if (res != globalHeaderSize)
			return "error: header read error while adding to existing zip";
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
	} else {
		fp = fopen(zipname.c_str(), "wb");
	}
	if (!fp)
		return "error: unable to open file";

	const std::vector<char> npyHeader = CreateHeaderNPY(shape, std::abs(type), wordSize);
	const size_t nbytes = SizeBytes() + npyHeader.size();

	// get the CRC of the data to be added
	uint32_t crc = crc32(0L, (uint8_t*)npyHeader.data(), (uLong)npyHeader.size());
	crc = crc32(crc, Data(), (uLong)SizeBytes());

	// append NPY extension
	varname += ".npy";

	// build the local header
	std::vector<char> localHeader;
	add(localHeader, "PK"); // first part of signature
	add(localHeader, (uint16_t)0x0403); // second part of signature
	add(localHeader, (uint16_t)20); // min version to extract
	add(localHeader, (uint16_t)0); // general purpose bit flag
	add(localHeader, (uint16_t)0); // compression method
	add(localHeader, (uint16_t)0); // file last mod time
	add(localHeader, (uint16_t)0); // file last mod date
	add(localHeader, (uint32_t)crc); // CRC
	add(localHeader, (uint32_t)nbytes); // compressed size
	add(localHeader, (uint32_t)nbytes); // uncompressed size
	add(localHeader, (uint16_t)varname.size()); // variable name length
	add(localHeader, (uint16_t)0); // extra field length
	add(localHeader, varname);

	// build global header
	add(globalHeader, "PK"); // first part of signature
	add(globalHeader, (uint16_t)0x0201); // second part of signature
	add(globalHeader, (uint16_t)20); // version made by
	globalHeader.insert(globalHeader.end(), localHeader.begin()+4, localHeader.begin()+30);
	add(globalHeader, (uint16_t)0); // file comment length
	add(globalHeader, (uint16_t)0); // disk number where file starts
	add(globalHeader, (uint16_t)0); // internal file attributes
	add(globalHeader, (uint32_t)0); // external file attributes
	add(globalHeader, (uint32_t)globalHeaderOffset); // relative offset of local file header, since it begins where the global header used to begin
	add(globalHeader, varname);

	// build footer
	std::vector<char> footer;
	add(footer, "PK"); // first part of signature
	add(footer, (uint16_t)0x0605); // second part of signature
	add(footer, (uint16_t)0); // number of this disk
	add(footer, (uint16_t)0); // disk where footer starts
	add(footer, (uint16_t)(nrecs+1)); // number of records on this disk
	add(footer, (uint16_t)(nrecs+1)); // total number of records
	add(footer, (uint32_t)globalHeader.size()); // number of bytes of global headers
	add(footer, (uint32_t)(globalHeaderOffset + nbytes + localHeader.size())); // offset of start of global headers, since global header now starts after newly written array
	add(footer, (uint16_t)0); // zip file comment length

	// write everything
	fwrite(localHeader.data(), sizeof(char), localHeader.size(), fp);
	fwrite(npyHeader.data(), sizeof(char), npyHeader.size(), fp);
	fwrite(Data(), wordSize, numValues, fp);
	fwrite(globalHeader.data(), sizeof(char), globalHeader.size(), fp);
	fwrite(footer.data(), sizeof(char), footer.size(), fp);
	fclose(fp);
	return NULL;
}